

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

Path * __thiscall Path::parentDir(Path *__return_storage_ptr__,Path *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  _Alloc_hider local_38;
  ulong local_30;
  size_type local_28;
  undefined8 uStack_20;
  
  sVar2 = (this->super_String).mString._M_string_length;
  if (sVar2 == 0) {
LAB_0014ea2f:
    (__return_storage_ptr__->super_String).mString._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->super_String).mString.field_2;
    (__return_storage_ptr__->super_String).mString._M_string_length = 0;
    (__return_storage_ptr__->super_String).mString.field_2._M_local_buf[0] = '\0';
  }
  else {
    if (sVar2 == 1) {
      pcVar6 = (this->super_String).mString._M_dataplus._M_p;
      if (*pcVar6 == '/') goto LAB_0014ea2f;
    }
    else {
      pcVar6 = (this->super_String).mString._M_dataplus._M_p;
    }
    local_38._M_p = (pointer)&local_28;
    std::__cxx11::string::_M_construct<char*>((string *)&local_38,pcVar6,pcVar6 + sVar2);
    uVar7 = (local_30 & 0xffffffff) + 1;
    uVar5 = (uint)local_30;
    do {
      uVar5 = uVar5 - 1;
      if ((int)uVar5 < 0) goto LAB_0014eaae;
      uVar4 = (ulong)((int)uVar7 - 2U & 0x7fffffff);
      if (local_30 <= uVar4) goto LAB_0014eb23;
      uVar7 = uVar7 - 1;
    } while (local_38._M_p[uVar4] == '/');
    do {
      uVar4 = (ulong)uVar5;
      if (local_30 <= uVar4) {
LAB_0014eb23:
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar4);
LAB_0014eb34:
        __assert_fail("copy.endsWith(\'/\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Path.cpp"
                      ,0x37,"Path Path::parentDir() const");
      }
      if (local_38._M_p[uVar4] == '/') {
        if (((local_30 <= uVar7) ||
            (std::__cxx11::string::resize((ulong)&local_38,(char)uVar7), local_30 != 0)) &&
           (local_38._M_p[local_30 - 1] == '/')) {
          paVar1 = &(__return_storage_ptr__->super_String).mString.field_2;
          (__return_storage_ptr__->super_String).mString._M_dataplus._M_p = (pointer)paVar1;
          if ((size_type *)local_38._M_p == &local_28) {
            paVar1->_M_allocated_capacity = local_28;
            *(undefined8 *)((long)&(__return_storage_ptr__->super_String).mString.field_2 + 8) =
                 uStack_20;
          }
          else {
            (__return_storage_ptr__->super_String).mString._M_dataplus._M_p = local_38._M_p;
            (__return_storage_ptr__->super_String).mString.field_2._M_allocated_capacity = local_28;
          }
          (__return_storage_ptr__->super_String).mString._M_string_length = local_30;
          return __return_storage_ptr__;
        }
        goto LAB_0014eb34;
      }
      uVar7 = uVar7 - 1;
      bVar3 = 0 < (int)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar3);
LAB_0014eaae:
    (__return_storage_ptr__->super_String).mString._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->super_String).mString.field_2;
    (__return_storage_ptr__->super_String).mString._M_string_length = 0;
    (__return_storage_ptr__->super_String).mString.field_2._M_local_buf[0] = '\0';
    if ((size_type *)local_38._M_p != &local_28) {
      operator_delete(local_38._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::parentDir() const
{
    if (isEmpty())
        return Path();
    if (size() == 1 && at(0) == '/')
        return Path();
    Path copy = *this;
    int i = copy.size() - 1;
    while (i >= 0 && copy.at(i) == '/')
        --i;
    while (i >= 0 && copy.at(i) != '/')
        --i;
    if (i < 0)
        return Path();
    copy.truncate(i + 1);
    assert(copy.endsWith('/'));
    return copy;
}